

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreePrevious(BtCursor *pCur)

{
  MemPage *pMVar1;
  byte bVar2;
  int iVar3;
  u32 newPgno;
  undefined8 in_RSI;
  
  bVar2 = pCur->eState;
  if (bVar2 != 0) {
    if (2 < bVar2) {
      iVar3 = btreeRestoreCursorPosition(pCur);
      if (iVar3 != 0) {
        return iVar3;
      }
      bVar2 = pCur->eState;
    }
    if (bVar2 == 1) {
      return 0x65;
    }
    if ((bVar2 == 2) && (pCur->eState = '\0', pCur->skipNext < 0)) {
      return 0;
    }
  }
  pMVar1 = pCur->pPage;
  if (pMVar1->leaf == '\0') {
    newPgno = sqlite3Get4byte(pMVar1->aData +
                              (CONCAT11(pMVar1->aCellIdx[(ulong)pCur->ix * 2],
                                        pMVar1->aCellIdx[(ulong)pCur->ix * 2 + 1]) &
                              pMVar1->maskPage));
    iVar3 = moveToChild(pCur,newPgno);
    if (iVar3 == 0) {
      iVar3 = moveToRightmost(pCur);
      return iVar3;
    }
  }
  else {
    while (pCur->ix == 0) {
      if (pCur->iPage == '\0') {
        pCur->eState = '\x01';
        return 0x65;
      }
      moveToParent(pCur);
    }
    pCur->ix = pCur->ix - 1;
    iVar3 = 0;
    if ((pCur->pPage->intKey != '\0') && (pCur->pPage->leaf == '\0')) {
      iVar3 = sqlite3BtreePrevious(pCur,(int)in_RSI);
      return iVar3;
    }
  }
  return iVar3;
}

Assistant:

static SQLITE_NOINLINE int btreePrevious(BtCursor *pCur){
  int rc;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & (BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey))==0 );
  assert( pCur->info.nSize==0 );
  if( pCur->eState!=CURSOR_VALID ){
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      return SQLITE_DONE;
    }
    if( CURSOR_SKIPNEXT==pCur->eState ){
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext<0 ) return SQLITE_OK;
    }
  }

  pPage = pCur->pPage;
  assert( pPage->isInit );
  if( !pPage->leaf ){
    int idx = pCur->ix;
    rc = moveToChild(pCur, get4byte(findCell(pPage, idx)));
    if( rc ) return rc;
    rc = moveToRightmost(pCur);
  }else{
    while( pCur->ix==0 ){
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        return SQLITE_DONE;
      }
      moveToParent(pCur);
    }
    assert( pCur->info.nSize==0 );
    assert( (pCur->curFlags & (BTCF_ValidOvfl))==0 );

    pCur->ix--;
    pPage = pCur->pPage;
    if( pPage->intKey && !pPage->leaf ){
      rc = sqlite3BtreePrevious(pCur, 0);
    }else{
      rc = SQLITE_OK;
    }
  }
  return rc;
}